

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::can_unflip_without_unpacking(mip_level *this)

{
  bool bVar1;
  mip_level *in_RDI;
  bool can_unflip;
  bool local_1;
  
  bVar1 = is_valid(in_RDI);
  if (bVar1) {
    bVar1 = is_packed(in_RDI);
    if (bVar1) {
      local_1 = true;
      if ((in_RDI->m_orient_flags & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
        local_1 = dxt_image::can_flip(in_RDI->m_pDXTImage,0);
      }
      if (((in_RDI->m_orient_flags & cOrientationFlagYFlipped) != cDefaultOrientationFlags) &&
         (bVar1 = dxt_image::can_flip(in_RDI->m_pDXTImage,1), !bVar1)) {
        local_1 = false;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mip_level::can_unflip_without_unpacking() const {
  if (!is_valid())
    return false;

  if (!is_packed())
    return true;

  bool can_unflip = true;
  if (m_orient_flags & cOrientationFlagXFlipped) {
    if (!m_pDXTImage->can_flip(0))
      can_unflip = false;
  }
  if (m_orient_flags & cOrientationFlagYFlipped) {
    if (!m_pDXTImage->can_flip(1))
      can_unflip = false;
  }

  return can_unflip;
}